

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O1

Stats * __thiscall
Enhedron::Test::Impl::Impl_Suite::
Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:139:30)>_>
::run(Stats *__return_storage_ptr__,
     Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:139:30)>_>
     *this,PathList *pathList,Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results,
     size_t depth)

{
  pointer *ppSVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  Results *pRVar5;
  pointer pcVar6;
  iterator __position;
  pointer pSVar7;
  uint64_t uVar8;
  Out<Enhedron::Test::Impl::Impl_Suite::WhenRunner> OVar9;
  bool bVar10;
  size_t sVar11;
  StackElement *pSVar12;
  string *psVar13;
  uint64_t uVar14;
  bool result_d;
  bool result_c;
  bool result_b;
  bool result_a;
  bool result_d_1;
  bool result_c_1;
  bool result_b_1;
  bool result_a_1;
  Finally stack;
  Finally stack_1;
  bool local_3d8 [16];
  ulong *local_3c8;
  undefined8 local_3c0;
  ulong local_3b8;
  undefined8 uStack_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a8;
  ulong local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  string local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  size_type local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  string local_348;
  ulong local_328;
  WhenRunner local_320;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278;
  undefined4 uStack_277;
  undefined3 uStack_273;
  undefined4 uStack_270;
  undefined1 uStack_26c;
  ushort local_26b;
  char local_269;
  ContextResultsRecorder *local_268;
  string *local_260;
  Stats *local_258;
  NameStack *local_250;
  Finally local_248;
  Finally local_238;
  Finally local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  Check local_1f8;
  undefined1 local_1c8 [32];
  char *local_1a8;
  bool *local_1a0;
  char *local_198;
  int local_190;
  char *local_188;
  char *local_178;
  bool *local_170;
  char *local_168;
  int local_160;
  StackElement local_158;
  StackElement local_148;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>
  local_130;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>
  local_e0;
  UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>
  local_90;
  
  psVar13 = &this->name;
  pRVar5 = ((results.value)->results_).value;
  local_250 = &(results.value)->contextStack_;
  (*pRVar5->_vptr_Results[5])(pRVar5,local_250,psVar13);
  __return_storage_ptr__->checks_ = 0;
  __return_storage_ptr__->failedTests_ = 0;
  __return_storage_ptr__->fixtures_ = 0;
  __return_storage_ptr__->tests_ = 0;
  __return_storage_ptr__->failedChecks_ = 0;
  bVar10 = included(this,pathList,depth);
  if (bVar10) {
    pcVar6 = (this->name)._M_dataplus._M_p;
    local_218 = &local_208;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,pcVar6,pcVar6 + (this->name)._M_string_length);
    local_320.whenResultRecorder_.given_._M_string_length = local_210;
    local_320.super_FailureHandler._vptr_FailureHandler = (_func_int **)&PTR__WhenRunner_0016ec28;
    local_320.stats_.tests_ = 0;
    local_320.stats_.checks_ = 0;
    local_320.stats_.failedTests_ = 0;
    local_320.stats_.failedChecks_ = 0;
    local_320.whenStack.
    super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (StackElement *)0x0;
    local_320.whenStack.
    super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (StackElement *)0x0;
    if (local_218 == &local_208) {
      local_1c8._24_8_ = local_208._8_8_;
      local_1c8._0_8_ = local_1c8 + 0x10;
    }
    else {
      local_1c8._0_8_ = local_218;
    }
    local_1c8._17_7_ = local_208._M_allocated_capacity._1_7_;
    local_1c8[0x10] = local_208._M_local_buf[0];
    local_1c8._8_8_ = local_210;
    local_210 = 0;
    local_208._M_local_buf[0] = '\0';
    local_320.whenResultRecorder_.given_._M_dataplus._M_p =
         (pointer)&local_320.whenResultRecorder_.given_.field_2;
    local_320.whenResultRecorder_.super_FailureHandler._vptr_FailureHandler =
         (_func_int **)&PTR__WhenResultRecorder_0016ec78;
    if ((undefined1 *)local_1c8._0_8_ == local_1c8 + 0x10) {
      local_320.whenResultRecorder_.given_.field_2._8_8_ = local_1c8._24_8_;
    }
    else {
      local_320.whenResultRecorder_.given_._M_dataplus._M_p = (pointer)local_1c8._0_8_;
    }
    local_320.whenResultRecorder_.given_.field_2._M_allocated_capacity = local_1c8._16_8_;
    local_320.whenResultRecorder_.whenStack_.stack_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_320.whenResultRecorder_.whenStack_.stack_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_320.whenResultRecorder_.whenStack_.stack_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_320.whenStack.
    super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (StackElement *)0x0;
    local_320.whenDepth_ = 0;
    pSVar12 = local_320.whenStack.
              super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_218 = &local_208;
    local_258 = __return_storage_ptr__;
    local_260 = psVar13;
    local_268 = results.value;
    local_320.whenResultRecorder_.results_.value = results.value;
    local_320.stats_.fixtures_ = 1;
    do {
      for (; pSVar12 !=
             local_320.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_finish; pSVar12 = pSVar12 + 1) {
        pSVar12->current = 0;
      }
      local_1f8.whenRunner_.value = &local_320;
      local_1f8.stats_.failedChecks_ = 0;
      local_1f8.stats_.checks_ = 0;
      local_1f8.stats_.failedTests_ = 0;
      local_1f8.stats_.fixtures_ = 0;
      local_1f8.stats_.tests_ = 0;
      uStack_270 = 0x6d617320;
      uStack_26c = 0x65;
      uStack_277 = 0x20796568;
      uStack_273 = 0x657261;
      local_26b = local_26b & 0xff00;
      local_358._M_allocated_capacity = 0x6572612079656874;
      local_358._8_4_ = 0x6d617320;
      local_358._M_local_buf[0xc] = 'e';
      local_358._13_2_ = local_26b;
      local_358._M_local_buf[0xf] = local_269;
      local_360 = 0xd;
      local_280 = 0;
      local_278 = 0;
      local_368 = &local_358;
      local_288 = &local_278;
      if ((ulong)((long)local_320.whenStack.
                        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_320.whenStack.
                        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= local_320.whenDepth_) {
        local_158.index = 0;
        local_158.current = 0;
        if (local_320.whenStack.
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_320.whenStack.
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
          ::_M_realloc_insert<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>
                    (&local_320.whenStack,
                     (iterator)
                     local_320.whenStack.
                     super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_158);
        }
        else {
          (local_320.whenStack.
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           ._M_impl.super__Vector_impl_data._M_finish)->index = 0;
          (local_320.whenStack.
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current = 0;
          local_320.whenStack.
          super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_320.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      local_238.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )operator_new(0x10);
      ((BaseFunctor *)
      local_238.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl)->
      _vptr_BaseFunctor = (_func_int **)&PTR__BaseFunctor_0016e350;
      ((BaseFunctor *)
      ((long)local_238.functor._M_t.
             super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             ._M_t.
             super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
             _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)&local_320;
      local_238.valid = true;
      if (local_320.whenStack.
          super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
          ._M_impl.super__Vector_impl_data._M_start[local_320.whenDepth_].index ==
          local_320.whenStack.
          super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
          ._M_impl.super__Vector_impl_data._M_start[local_320.whenDepth_].current) {
        local_320.whenDepth_ = local_320.whenDepth_ + 1;
        if (local_368 == &local_358) {
          local_388.field_2._8_8_ =
               CONCAT17(local_358._M_local_buf[0xf],
                        CONCAT25(local_358._13_2_,
                                 CONCAT14(local_358._M_local_buf[0xc],local_358._8_4_)));
          local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        }
        else {
          local_388._M_dataplus._M_p = (pointer)local_368;
        }
        local_388.field_2._M_allocated_capacity = local_358._M_allocated_capacity;
        local_388._M_string_length = local_360;
        local_360 = 0;
        local_358._M_allocated_capacity = local_358._M_allocated_capacity & 0xffffffffffffff00;
        local_368 = &local_358;
        WhenResultRecorder::push(&local_320.whenResultRecorder_,&local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        local_248.functor._M_t.
        super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
        ._M_t.
        super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
        .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
             (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
              )operator_new(0x10);
        *(undefined ***)
         local_248.functor._M_t.
         super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
         ._M_t.
         super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
         .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
             &PTR__BaseFunctor_0016e390;
        ((BaseFunctor *)
        ((long)local_248.functor._M_t.
               super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
               ._M_t.
               super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
               .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
               _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)&local_320;
        local_248.valid = true;
        local_3d8[3] = true;
        local_3d8[2] = true;
        local_3d8[1] = false;
        local_3d8[0] = false;
        local_130.lhs.variableName = "result_a";
        local_130.lhs.value = local_3d8 + 3;
        local_130.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_130.lhs.line = 0x9a;
        local_130.rhs.variableName = "result_b";
        local_130.rhs.value = local_3d8 + 2;
        local_130.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_130.rhs.line = 0x9a;
        local_130.operatorName = "&&";
        Check::
        operator()<const_char_(&)[17],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>
                  (&local_1f8,(char (*) [17])"true is returned",&local_130);
        local_90.arg.operatorName = "&&";
        local_90.arg.lhs.variableName = "result_c";
        local_90.arg.lhs.value = local_3d8 + 1;
        local_90.arg.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_90.arg.lhs.line = 0x9c;
        local_90.arg.rhs.variableName = "result_d";
        local_90.arg.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_90.arg.rhs.line = 0x9c;
        local_90.operatorName = "!";
        local_90.arg.rhs.value = local_3d8;
        Check::
        operator()<const_char_(&)[18],_Enhedron::Assertion::Impl::Configurable::UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>_>
                  (&local_1f8,(char (*) [18])"false is returned",&local_90);
        Enhedron::Impl::Util::Finally::~Finally(&local_248);
      }
      Enhedron::Impl::Util::Finally::~Finally(&local_238);
      if (local_368 != &local_358) {
        operator_delete(local_368,local_358._M_allocated_capacity + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,CONCAT35(uStack_273,CONCAT41(uStack_277,local_278)) + 1);
      }
      local_328 = 0x23;
      local_3c8 = &local_3b8;
      local_3a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)::std::__cxx11::string::_M_create((ulong *)&local_3c8,(ulong)&local_328);
      OVar9.value = local_1f8.whenRunner_.value;
      *(undefined8 *)(local_3a8->_M_local_buf + 0x10) = 0x6920746e656e6f70;
      *(undefined8 *)(local_3a8->_M_local_buf + 0x18) = 0x7265666669642073;
      local_3a8->_M_allocated_capacity = 0x747361656c207461;
      *(undefined8 *)(local_3a8->_M_local_buf + 8) = 0x6d6f6320656e6f20;
      *(char *)((long)local_3a8 + 0x1f) = 'r';
      *(char *)((long)local_3a8 + 0x20) = 'e';
      *(char *)((long)local_3a8 + 0x21) = 'n';
      *(char *)((long)local_3a8 + 0x22) = 't';
      local_3a8->_M_local_buf[local_328] = '\0';
      if (local_3a8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_3b8) {
        local_398._8_8_ = uStack_3b0;
        local_3a8 = &local_398;
      }
      local_398._M_allocated_capacity = local_328;
      local_3a0 = local_328;
      local_3c0 = 0;
      local_3b8 = local_328 & 0xffffffffffffff00;
      __position._M_current =
           ((local_1f8.whenRunner_.value)->whenStack).
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_3c8 = &local_3b8;
      if ((ulong)((long)__position._M_current -
                  (long)((local_1f8.whenRunner_.value)->whenStack).
                        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <=
          (local_1f8.whenRunner_.value)->whenDepth_) {
        local_148.index = 0;
        local_148.current = 0;
        if (__position._M_current ==
            ((local_1f8.whenRunner_.value)->whenStack).
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
          ::_M_realloc_insert<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>
                    (&(local_1f8.whenRunner_.value)->whenStack,__position,&local_148);
        }
        else {
          (__position._M_current)->index = 0;
          (__position._M_current)->current = 0;
          ppSVar1 = &((local_1f8.whenRunner_.value)->whenStack).
                     super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
      }
      local_228.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )operator_new(0x10);
      *(undefined ***)
       local_228.functor._M_t.
       super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
       ._M_t.
       super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
       .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           &PTR__BaseFunctor_0016e3d0;
      ((BaseFunctor *)
      ((long)local_228.functor._M_t.
             super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             ._M_t.
             super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
             _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)OVar9.value;
      local_228.valid = true;
      pSVar7 = ((OVar9.value)->whenStack).
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar11 = (OVar9.value)->whenDepth_;
      if (pSVar7[sVar11].index == pSVar7[sVar11].current) {
        (OVar9.value)->whenDepth_ = sVar11 + 1;
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        if (local_3a8 == &local_398) {
          local_348.field_2._8_8_ = local_398._8_8_;
        }
        else {
          local_348._M_dataplus._M_p = (pointer)local_3a8;
        }
        local_348.field_2._M_allocated_capacity = local_398._M_allocated_capacity;
        local_348._M_string_length = local_3a0;
        local_3a0 = 0;
        local_398._M_allocated_capacity = local_398._M_allocated_capacity & 0xffffffffffffff00;
        local_3a8 = &local_398;
        WhenResultRecorder::push(&(OVar9.value)->whenResultRecorder_,&local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        local_388._M_dataplus._M_p = (pointer)operator_new(0x10);
        *(undefined ***)local_388._M_dataplus._M_p = &PTR__BaseFunctor_0016e410;
        *(WhenRunner **)(local_388._M_dataplus._M_p + 8) = OVar9.value;
        local_388._M_string_length = CONCAT71(local_388._M_string_length._1_7_,1);
        local_3d8[7] = false;
        local_3d8[6] = false;
        local_3d8[5] = true;
        local_3d8[4] = true;
        local_1c8._16_8_ = "!";
        local_1a8 = "result_a";
        local_1a0 = local_3d8 + 7;
        local_198 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_190 = 0xa7;
        local_188 = "!";
        local_178 = "result_b";
        local_170 = local_3d8 + 6;
        local_168 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_160 = 0xa7;
        local_1c8._0_8_ = "&&";
        Check::
        operator()<const_char_(&)[18],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>_>
                  (&local_1f8,(char (*) [18])"false is returned",
                   (BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::UnaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1030:27),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>
                    *)local_1c8);
        local_e0.lhs.variableName = "result_c";
        local_e0.lhs.value = local_3d8 + 5;
        local_e0.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_e0.lhs.line = 0xa9;
        local_e0.rhs.variableName = "result_d";
        local_e0.rhs.value = local_3d8 + 4;
        local_e0.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_e0.rhs.line = 0xa9;
        local_e0.operatorName = "&&";
        Check::
        operator()<const_char_(&)[17],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<bool>_>_>
                  (&local_1f8,(char (*) [17])"true is returned",&local_e0);
        Enhedron::Impl::Util::Finally::~Finally((Finally *)&local_388);
      }
      Enhedron::Impl::Util::Finally::~Finally(&local_228);
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,local_398._M_allocated_capacity + 1);
      }
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8,local_3b8 + 1);
      }
      bVar10 = local_320.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_320.whenStack.
               super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar10) {
        pSVar12 = local_320.whenStack.
                  super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        sVar11 = local_320.whenStack.
                 super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].index + 1;
        if (local_320.whenStack.
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].current == sVar11) {
          do {
            local_320.whenStack.
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_finish = pSVar12;
            if (local_320.whenStack.
                super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_320.whenStack.
                super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              bVar10 = true;
              goto LAB_00134dc3;
            }
            pSVar12 = local_320.whenStack.
                      super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1;
            sVar11 = local_320.whenStack.
                     super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].index + 1;
          } while (local_320.whenStack.
                   super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].current == sVar11);
        }
        pSVar12->index = sVar11;
        bVar10 = false;
      }
LAB_00134dc3:
      uVar14 = local_320.stats_.fixtures_ + local_1f8.stats_.fixtures_;
      local_320.stats_.tests_ = local_320.stats_.tests_ + 1 + local_1f8.stats_.tests_;
      uVar2 = local_320.stats_.checks_ + local_1f8.stats_.checks_;
      uVar3 = local_320.stats_.failedTests_ + local_1f8.stats_.failedTests_;
      uVar4 = local_320.stats_.failedChecks_ + local_1f8.stats_.failedChecks_;
      pSVar12 = local_320.whenStack.
                super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_320.stats_.failedChecks_ = uVar4;
      local_320.stats_.failedTests_ = uVar3;
      local_320.stats_.checks_ = uVar2;
      local_320.stats_.fixtures_ = uVar14;
    } while (!bVar10);
    if (local_320.stats_.tests_ == 0) {
      local_320.stats_.tests_ = 1;
    }
    uVar8 = local_320.stats_.tests_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_320.whenResultRecorder_.whenStack_.stack_);
    results.value = local_268;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320.whenResultRecorder_.given_._M_dataplus._M_p !=
        &local_320.whenResultRecorder_.given_.field_2) {
      operator_delete(local_320.whenResultRecorder_.given_._M_dataplus._M_p,
                      (ulong)(local_320.whenResultRecorder_.given_.field_2._M_allocated_capacity + 1
                             ));
    }
    if (local_320.whenStack.
        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
        ._M_impl.super__Vector_impl_data._M_start != (StackElement *)0x0) {
      operator_delete(local_320.whenStack.
                      super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_320.whenStack.
                            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_320.whenStack.
                            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_258->fixtures_ = local_258->fixtures_ + uVar14;
    local_258->tests_ = local_258->tests_ + uVar8;
    local_258->checks_ = local_258->checks_ + uVar2;
    local_258->failedTests_ = local_258->failedTests_ + uVar3;
    local_258->failedChecks_ = local_258->failedChecks_ + uVar4;
    psVar13 = local_260;
    __return_storage_ptr__ = local_258;
  }
  pRVar5 = ((results.value)->results_).value;
  (*pRVar5->_vptr_Results[6])(pRVar5,__return_storage_ptr__,local_250,psVar13);
  return __return_storage_ptr__;
}

Assistant:

virtual Stats run(const PathList& pathList, Out<ContextResultsRecorder> results, size_t depth) override {
            results->beginGiven(name);
            Stats stats;

            if (included(pathList, depth)) {
                stats += args.applyExtraBefore(runTest, name, results);
            }

            results->endGiven(stats, name);

            return stats;
        }